

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool re2::IsValidUTF8(StringPiece *s,RegexpStatus *status)

{
  int iVar1;
  int iVar2;
  Rune r;
  StringPiece t;
  Rune local_3c;
  StringPiece local_38;
  
  local_38.ptr_ = s->ptr_;
  local_38.length_ = s->length_;
  local_38._12_4_ = *(undefined4 *)&s->field_0xc;
  do {
    iVar1 = local_38.length_;
    if (local_38.length_ < 1) break;
    iVar2 = StringPieceToRune(&local_3c,&local_38,status);
  } while (-1 < iVar2);
  return iVar1 < 1;
}

Assistant:

static bool IsValidUTF8(const StringPiece& s, RegexpStatus* status) {
  StringPiece t = s;
  Rune r;
  while (t.size() > 0) {
    if (StringPieceToRune(&r, &t, status) < 0)
      return false;
  }
  return true;
}